

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# column_data.cpp
# Opt level: O3

void __thiscall
duckdb::ColumnData::UpdateInternal
          (ColumnData *this,TransactionData transaction,idx_t column_index,Vector *update_vector,
          row_t *row_ids,idx_t update_count,Vector *base_vector)

{
  unique_ptr<duckdb::UpdateSegment,_std::default_delete<duckdb::UpdateSegment>,_true> *this_00;
  _Head_base<0UL,_duckdb::UpdateSegment_*,_false> this_01;
  int iVar1;
  _Head_base<0UL,_duckdb::UpdateSegment_*,_false> this_02;
  pointer this_03;
  
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)&this->update_lock);
  if (iVar1 == 0) {
    this_00 = &this->updates;
    if ((this->updates).
        super_unique_ptr<duckdb::UpdateSegment,_std::default_delete<duckdb::UpdateSegment>_>._M_t.
        super___uniq_ptr_impl<duckdb::UpdateSegment,_std::default_delete<duckdb::UpdateSegment>_>.
        _M_t.
        super__Tuple_impl<0UL,_duckdb::UpdateSegment_*,_std::default_delete<duckdb::UpdateSegment>_>
        .super__Head_base<0UL,_duckdb::UpdateSegment_*,_false>._M_head_impl == (UpdateSegment *)0x0)
    {
      this_02._M_head_impl = (UpdateSegment *)operator_new(0x130);
      UpdateSegment::UpdateSegment(this_02._M_head_impl,this);
      this_01._M_head_impl =
           (this_00->
           super_unique_ptr<duckdb::UpdateSegment,_std::default_delete<duckdb::UpdateSegment>_>).
           _M_t.
           super___uniq_ptr_impl<duckdb::UpdateSegment,_std::default_delete<duckdb::UpdateSegment>_>
           ._M_t.
           super__Tuple_impl<0UL,_duckdb::UpdateSegment_*,_std::default_delete<duckdb::UpdateSegment>_>
           .super__Head_base<0UL,_duckdb::UpdateSegment_*,_false>._M_head_impl;
      (this_00->super_unique_ptr<duckdb::UpdateSegment,_std::default_delete<duckdb::UpdateSegment>_>
      )._M_t.
      super___uniq_ptr_impl<duckdb::UpdateSegment,_std::default_delete<duckdb::UpdateSegment>_>._M_t
      .super__Tuple_impl<0UL,_duckdb::UpdateSegment_*,_std::default_delete<duckdb::UpdateSegment>_>.
      super__Head_base<0UL,_duckdb::UpdateSegment_*,_false>._M_head_impl = this_02._M_head_impl;
      if (this_01._M_head_impl != (UpdateSegment *)0x0) {
        UpdateSegment::~UpdateSegment(this_01._M_head_impl);
        operator_delete(this_01._M_head_impl);
      }
    }
    this_03 = unique_ptr<duckdb::UpdateSegment,_std::default_delete<duckdb::UpdateSegment>,_true>::
              operator->(this_00);
    UpdateSegment::Update
              (this_03,transaction,column_index,update_vector,row_ids,update_count,base_vector);
    pthread_mutex_unlock((pthread_mutex_t *)&this->update_lock);
    return;
  }
  ::std::__throw_system_error(iVar1);
}

Assistant:

void ColumnData::UpdateInternal(TransactionData transaction, idx_t column_index, Vector &update_vector, row_t *row_ids,
                                idx_t update_count, Vector &base_vector) {
	lock_guard<mutex> update_guard(update_lock);
	if (!updates) {
		updates = make_uniq<UpdateSegment>(*this);
	}
	updates->Update(transaction, column_index, update_vector, row_ids, update_count, base_vector);
}